

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::base::DefaultLogDispatchCallback::dispatch(DefaultLogDispatchCallback *this,string_t *logLine)

{
  bool bVar1;
  DispatchAction DVar2;
  LogMessage *pLVar3;
  fstream_t *pfVar4;
  Logger *this_00;
  long lVar5;
  ulong uVar6;
  Logger *pLVar7;
  ostream *this_01;
  string *in_RSI;
  long in_RDI;
  fstream_t *fs;
  Level in_stack_00000114;
  string_t *in_stack_00000118;
  LogBuilder *in_stack_00000120;
  undefined8 in_stack_ffffffffffffff98;
  Level level;
  TypedConfigurations *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  Level level_00;
  Logger *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  Level level_01;
  
  level = (Level)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  level_01 = (Level)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  level_00 = (Level)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  DVar2 = LogDispatchData::dispatchAction(*(LogDispatchData **)(in_RDI + 0x50));
  if (DVar2 != NormalLog) {
    return;
  }
  pLVar3 = LogDispatchData::logMessage(*(LogDispatchData **)(in_RDI + 0x50));
  LogMessage::logger(pLVar3);
  pLVar3 = LogDispatchData::logMessage(*(LogDispatchData **)(in_RDI + 0x50));
  LogMessage::level(pLVar3);
  bVar1 = TypedConfigurations::toFile(in_stack_ffffffffffffffa0,level);
  if (bVar1) {
    pLVar3 = LogDispatchData::logMessage(*(LogDispatchData **)(in_RDI + 0x50));
    LogMessage::logger(pLVar3);
    pLVar3 = LogDispatchData::logMessage(*(LogDispatchData **)(in_RDI + 0x50));
    LogMessage::level(pLVar3);
    pfVar4 = TypedConfigurations::fileStream(in_stack_ffffffffffffffa0,level);
    if (pfVar4 != (fstream_t *)0x0) {
      this_00 = (Logger *)(pfVar4 + 0x10);
      lVar5 = std::__cxx11::string::c_str();
      std::__cxx11::string::size();
      std::ostream::write((char *)this_00,lVar5);
      uVar6 = std::ios::fail();
      if ((uVar6 & 1) == 0) {
        std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x231cbd);
        bVar1 = Storage::hasFlag((Storage *)in_stack_ffffffffffffffa0,level);
        if (!bVar1) {
          pLVar3 = LogDispatchData::logMessage(*(LogDispatchData **)(in_RDI + 0x50));
          pLVar7 = LogMessage::logger(pLVar3);
          level_01 = (Level)((ulong)pLVar7 >> 0x20);
          pLVar3 = LogDispatchData::logMessage(*(LogDispatchData **)(in_RDI + 0x50));
          LogMessage::level(pLVar3);
          bVar1 = Logger::isFlushNeeded(in_stack_ffffffffffffffb0,level_00);
          if (!bVar1) goto LAB_00231d61;
        }
        pLVar3 = LogDispatchData::logMessage(*(LogDispatchData **)(in_RDI + 0x50));
        pLVar7 = LogMessage::logger(pLVar3);
        pLVar3 = LogDispatchData::logMessage(*(LogDispatchData **)(in_RDI + 0x50));
        LogMessage::level(pLVar3);
        Logger::flush(this_00,level_01,(fstream_t *)pLVar7);
      }
    }
  }
LAB_00231d61:
  pLVar3 = LogDispatchData::logMessage(*(LogDispatchData **)(in_RDI + 0x50));
  LogMessage::logger(pLVar3);
  pLVar3 = LogDispatchData::logMessage(*(LogDispatchData **)(in_RDI + 0x50));
  LogMessage::level(pLVar3);
  bVar1 = TypedConfigurations::toStandardOutput(in_stack_ffffffffffffffa0,level);
  if (bVar1) {
    std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x231dba);
    bVar1 = Storage::hasFlag((Storage *)in_stack_ffffffffffffffa0,level);
    if (bVar1) {
      pLVar3 = LogDispatchData::logMessage(*(LogDispatchData **)(in_RDI + 0x50));
      LogMessage::logger(pLVar3);
      Logger::logBuilder((Logger *)0x231deb);
      pLVar3 = LogDispatchData::logMessage(*(LogDispatchData **)(in_RDI + 0x50));
      LogMessage::level(pLVar3);
      LogBuilder::convertToColoredOutput(in_stack_00000120,in_stack_00000118,in_stack_00000114);
    }
    this_01 = std::operator<<((ostream *)&std::cout,in_RSI);
    std::ostream::operator<<(this_01,std::flush<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void DefaultLogDispatchCallback::dispatch(base::type::string_t&& logLine) {
  if (m_data->dispatchAction() == base::DispatchAction::NormalLog) {
    if (m_data->logMessage()->logger()->m_typedConfigurations->toFile(m_data->logMessage()->level())) {
      base::type::fstream_t* fs = m_data->logMessage()->logger()->m_typedConfigurations->fileStream(
                                    m_data->logMessage()->level());
      if (fs != nullptr) {
        fs->write(logLine.c_str(), logLine.size());
        if (fs->fail()) {
          ELPP_INTERNAL_ERROR("Unable to write log to file ["
                              << m_data->logMessage()->logger()->m_typedConfigurations->filename(m_data->logMessage()->level()) << "].\n"
                              << "Few possible reasons (could be something else):\n" << "      * Permission denied\n"
                              << "      * Disk full\n" << "      * Disk is not writable", true);
        } else {
          if (ELPP->hasFlag(LoggingFlag::ImmediateFlush)
              || (m_data->logMessage()->logger()->isFlushNeeded(m_data->logMessage()->level()))) {
            m_data->logMessage()->logger()->flush(m_data->logMessage()->level(), fs);
          }
        }
      } else {
        ELPP_INTERNAL_ERROR("Log file for [" << LevelHelper::convertToString(m_data->logMessage()->level()) << "] "
                            << "has not been configured but [TO_FILE] is configured to TRUE. [Logger ID: "
                            << m_data->logMessage()->logger()->id() << "]", false);
      }
    }
    if (m_data->logMessage()->logger()->m_typedConfigurations->toStandardOutput(m_data->logMessage()->level())) {
      if (ELPP->hasFlag(LoggingFlag::ColoredTerminalOutput))
        m_data->logMessage()->logger()->logBuilder()->convertToColoredOutput(&logLine, m_data->logMessage()->level());
      ELPP_COUT << ELPP_COUT_LINE(logLine);
    }
  }
#if defined(ELPP_SYSLOG)
  else if (m_data->dispatchAction() == base::DispatchAction::SysLog) {
    // Determine syslog priority
    int sysLogPriority = 0;
    if (m_data->logMessage()->level() == Level::Fatal)
      sysLogPriority = LOG_EMERG;
    else if (m_data->logMessage()->level() == Level::Error)
      sysLogPriority = LOG_ERR;
    else if (m_data->logMessage()->level() == Level::Warning)
      sysLogPriority = LOG_WARNING;
    else if (m_data->logMessage()->level() == Level::Info)
      sysLogPriority = LOG_INFO;
    else if (m_data->logMessage()->level() == Level::Debug)
      sysLogPriority = LOG_DEBUG;
    else
      sysLogPriority = LOG_NOTICE;
#  if defined(ELPP_UNICODE)
    char* line = base::utils::Str::wcharPtrToCharPtr(logLine.c_str());
    syslog(sysLogPriority, "%s", line);
    free(line);
#  else
    syslog(sysLogPriority, "%s", logLine.c_str());
#  endif
  }
#endif  // defined(ELPP_SYSLOG)
}